

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::externalize(Literal *__return_storage_ptr__,Literal *this)

{
  Type left;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  BasicHeapType BVar3;
  initializer_list<wasm::Literal> init;
  SmallVector<wasm::Literal,_1UL> local_c0;
  Type local_88;
  Literal local_80;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> local_58;
  HeapType local_48;
  HeapType heapType;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined4 local_2c;
  
  left.id = (this->type).id;
  wasm::Type::Type(&local_88,(HeapType)0x2,Nullable);
  bVar2 = wasm::Type::isSubType(left,local_88);
  if (!bVar2) {
    __assert_fail("Type::isSubType(type, Type(HeapType::any, Nullable)) && \"can only externalize internal references\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0xa25,"Literal wasm::Literal::externalize() const");
  }
  bVar2 = wasm::Type::isNull(&this->type);
  if (bVar2) {
    local_58._M_ptr = (element_type *)0x0;
    local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Literal(__return_storage_ptr__,(shared_ptr<wasm::GCData> *)&local_58,(HeapType)0xc);
    p_Var1 = &local_58;
  }
  else {
    local_48 = wasm::Type::getHeapType(&this->type);
    if (local_48.id < 0xe) {
      BVar3 = HeapType::getBasic(&local_48);
      if (BVar3 == i31) {
        local_2c = 4;
        Literal(&local_80,this);
        init._M_len = 1;
        init._M_array = &local_80;
        Literals::Literals((Literals *)&local_c0,init);
        std::make_shared<wasm::GCData,wasm::HeapType::BasicHeapType,wasm::Literals>
                  ((BasicHeapType *)&heapType,(Literals *)&stack0xffffffffffffffd4);
        Literal(__return_storage_ptr__,(shared_ptr<wasm::GCData> *)&heapType,(HeapType)0x0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_c0);
        ~Literal(&local_80);
        return __return_storage_ptr__;
      }
      if (3 < BVar3 - string) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                           ,0xa36);
      }
      handle_unreachable("TODO: string literals",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0xa34);
    }
    std::__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,(__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *)this);
    Literal(__return_storage_ptr__,(shared_ptr<wasm::GCData> *)&local_68,(HeapType)0x0);
    p_Var1 = &local_68;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::externalize() const {
  assert(Type::isSubType(type, Type(HeapType::any, Nullable)) &&
         "can only externalize internal references");
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapType::noext);
  }
  auto heapType = type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic()) {
      case HeapType::i31: {
        return Literal(std::make_shared<GCData>(HeapType::i31, Literals{*this}),
                       HeapType::ext);
      }
      case HeapType::string:
      case HeapType::stringview_wtf8:
      case HeapType::stringview_wtf16:
      case HeapType::stringview_iter:
        WASM_UNREACHABLE("TODO: string literals");
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  return Literal(gcData, HeapType::ext);
}